

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

void call_handler(JSContext *ctx,JSValue func)

{
  JSRefCountHeader *p;
  JSValue v;
  
  if (0xfffffff4 < (uint)func.tag) {
    *(int *)func.u.ptr = *func.u.ptr + 1;
  }
  v = JS_Call(ctx,func,(JSValue)(ZEXT816(3) << 0x40),0,(JSValue *)0x0);
  JS_FreeValue(ctx,func);
  if ((int)v.tag == 6) {
    js_std_dump_error(ctx);
  }
  JS_FreeValue(ctx,v);
  return;
}

Assistant:

static void call_handler(JSContext *ctx, JSValueConst func)
{
    JSValue ret, func1;
    /* 'func' might be destroyed when calling itself (if it frees the
       handler), so must take extra care */
    func1 = JS_DupValue(ctx, func);
    ret = JS_Call(ctx, func1, JS_UNDEFINED, 0, NULL);
    JS_FreeValue(ctx, func1);
    if (JS_IsException(ret))
        js_std_dump_error(ctx);
    JS_FreeValue(ctx, ret);
}